

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipm.cc
# Opt level: O0

void __thiscall
ipx::IPM::SolveNewtonSystem
          (IPM *this,double *rb,double *rc,double *rl,double *ru,double *sl,double *su,Step *step)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  State SVar4;
  double *pdVar5;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  long in_R8;
  long in_R9;
  double dVar6;
  double dVar7;
  long in_stack_00000008;
  valarray<double> *in_stack_00000010;
  double rcj;
  double atdy;
  Int j_4;
  double ruj_1;
  Int j_3;
  double rlj_1;
  Int j_2;
  double tol;
  double ruj;
  double rlj;
  Int j_1;
  Int j;
  Vector rhs2;
  Vector rhs1;
  Vector *dzu;
  Vector *dzl;
  Vector *dy;
  Vector *dxu;
  Vector *dxl;
  Vector *dx;
  Vector *zu;
  Vector *zl;
  Vector *xu;
  Vector *xl;
  SparseMatrix *AI;
  Int n;
  Int m;
  Model *model;
  undefined4 in_stack_fffffffffffffbd8;
  Int in_stack_fffffffffffffbdc;
  Iterate *in_stack_fffffffffffffbe0;
  Vector *in_stack_fffffffffffffbe8;
  valarray<double> *in_stack_fffffffffffffbf0;
  double in_stack_fffffffffffffbf8;
  Vector *in_stack_fffffffffffffc00;
  Vector *in_stack_fffffffffffffc08;
  SparseMatrix *in_stack_fffffffffffffc10;
  SparseMatrix *local_338;
  double local_2c0;
  double local_230;
  double local_158;
  double local_150;
  int local_11c;
  int local_10c;
  int local_fc;
  int local_cc;
  int local_c8;
  valarray<double> local_a8;
  valarray<double> *local_98;
  valarray<double> *local_90;
  valarray<double> *local_88;
  valarray<double> *local_80;
  valarray<double> *local_78;
  valarray<double> *local_70;
  Vector *local_68;
  Vector *local_60;
  Vector *local_58;
  Vector *local_50;
  SparseMatrix *local_48;
  Int local_40;
  Int local_3c;
  Model *local_38;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_38 = Iterate::model((Iterate *)in_RDI[2]);
  local_3c = Model::rows(local_38);
  local_40 = Model::cols(local_38);
  local_48 = Model::AI(local_38);
  local_50 = Iterate::xl((Iterate *)in_RDI[2]);
  local_58 = Iterate::xu((Iterate *)in_RDI[2]);
  local_60 = Iterate::zl((Iterate *)in_RDI[2]);
  local_68 = Iterate::zu((Iterate *)in_RDI[2]);
  local_70 = in_stack_00000010;
  local_78 = in_stack_00000010 + 1;
  local_80 = in_stack_00000010 + 2;
  local_88 = in_stack_00000010 + 3;
  local_90 = in_stack_00000010 + 4;
  local_98 = in_stack_00000010 + 5;
  std::valarray<double>::valarray
            ((valarray<double> *)in_stack_fffffffffffffbe0,
             CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  std::valarray<double>::valarray
            ((valarray<double> *)in_stack_fffffffffffffbe0,
             CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  if (local_18 != 0) {
    for (local_c8 = 0; local_c8 < local_40 + local_3c; local_c8 = local_c8 + 1) {
      dVar6 = *(double *)(local_18 + (long)local_c8 * 8);
      pdVar5 = std::valarray<double>::operator[](&local_a8,(long)local_c8);
      *pdVar5 = -dVar6;
    }
  }
  for (local_cc = 0; local_cc < local_40 + local_3c; local_cc = local_cc + 1) {
    if (local_20 == 0) {
      local_150 = 0.0;
    }
    else {
      local_150 = *(double *)(local_20 + (long)local_cc * 8);
    }
    if (local_28 == 0) {
      local_158 = 0.0;
    }
    else {
      local_158 = *(double *)(local_28 + (long)local_cc * 8);
    }
    bVar3 = Iterate::has_barrier_lb(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc);
    if (bVar3) {
      dVar6 = *(double *)(local_30 + (long)local_cc * 8);
      pdVar5 = std::valarray<double>::operator[](local_60,(long)local_cc);
      dVar7 = *pdVar5;
      pdVar5 = std::valarray<double>::operator[](local_50,(long)local_cc);
      dVar1 = *pdVar5;
      pdVar5 = std::valarray<double>::operator[](&local_a8,(long)local_cc);
      *pdVar5 = (dVar7 * local_150 + dVar6) / dVar1 + *pdVar5;
    }
    bVar3 = Iterate::has_barrier_ub(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc);
    if (bVar3) {
      dVar6 = *(double *)(in_stack_00000008 + (long)local_cc * 8);
      pdVar5 = std::valarray<double>::operator[](local_68,(long)local_cc);
      dVar7 = *pdVar5;
      pdVar5 = std::valarray<double>::operator[](local_58,(long)local_cc);
      dVar1 = *pdVar5;
      pdVar5 = std::valarray<double>::operator[](&local_a8,(long)local_cc);
      *pdVar5 = *pdVar5 - (dVar6 - dVar7 * local_158) / dVar1;
    }
    SVar4 = Iterate::StateOf((Iterate *)
                             CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),0);
    if (SVar4 == fixed) {
      pdVar5 = std::valarray<double>::operator[](&local_a8,(long)local_cc);
      *pdVar5 = 0.0;
    }
  }
  if (local_10 != 0) {
    std::begin<double>((valarray<double> *)in_stack_fffffffffffffbe0);
    std::copy<double_const*,double*>
              ((double *)in_stack_fffffffffffffbf0,(double *)in_stack_fffffffffffffbe8,
               (double *)in_stack_fffffffffffffbe0);
  }
  Control::kkt_tol((Control *)*in_RDI);
  dVar6 = Iterate::mu(in_stack_fffffffffffffbe0);
  sqrt(dVar6);
  KKTSolver::Solve((KKTSolver *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                   in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,
                   in_stack_fffffffffffffbe8,(Info *)in_stack_fffffffffffffbe0);
  if (*(int *)(in_RDI[3] + 0xc) == 0) {
    std::valarray<double>::operator*=(in_stack_fffffffffffffbf0,(double *)in_stack_fffffffffffffbe8)
    ;
    for (local_fc = 0; local_fc < local_40 + local_3c; local_fc = local_fc + 1) {
      SVar4 = Iterate::StateOf((Iterate *)
                               CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),0);
      if (SVar4 == fixed) {
        pdVar5 = std::valarray<double>::operator[](local_78,(long)local_fc);
        *pdVar5 = 0.0;
        pdVar5 = std::valarray<double>::operator[](local_90,(long)local_fc);
        *pdVar5 = 0.0;
      }
      else {
        SVar4 = Iterate::StateOf((Iterate *)
                                 CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),0);
        if (SVar4 == free) {
          pdVar5 = std::valarray<double>::operator[](local_78,(long)local_fc);
          *pdVar5 = 0.0;
          pdVar5 = std::valarray<double>::operator[](local_90,(long)local_fc);
          *pdVar5 = 0.0;
        }
        else {
          if (local_20 == 0) {
            local_230 = 0.0;
          }
          else {
            local_230 = *(double *)(local_20 + (long)local_fc * 8);
          }
          pdVar5 = std::valarray<double>::operator[](local_70,(long)local_fc);
          dVar6 = *pdVar5;
          pdVar5 = std::valarray<double>::operator[](local_78,(long)local_fc);
          *pdVar5 = dVar6 - local_230;
          dVar6 = *(double *)(local_30 + (long)local_fc * 8);
          pdVar5 = std::valarray<double>::operator[](local_60,(long)local_fc);
          dVar7 = *pdVar5;
          pdVar5 = std::valarray<double>::operator[](local_78,(long)local_fc);
          dVar1 = *pdVar5;
          pdVar5 = std::valarray<double>::operator[](local_50,(long)local_fc);
          dVar2 = *pdVar5;
          pdVar5 = std::valarray<double>::operator[](local_90,(long)local_fc);
          *pdVar5 = (dVar6 - dVar7 * dVar1) / dVar2;
        }
      }
    }
    for (local_10c = 0; local_10c < local_40 + local_3c; local_10c = local_10c + 1) {
      SVar4 = Iterate::StateOf((Iterate *)
                               CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),0);
      if (SVar4 == fixed) {
        pdVar5 = std::valarray<double>::operator[](local_80,(long)local_10c);
        *pdVar5 = 0.0;
        pdVar5 = std::valarray<double>::operator[](local_98,(long)local_10c);
        *pdVar5 = 0.0;
      }
      else {
        SVar4 = Iterate::StateOf((Iterate *)
                                 CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),0);
        if (SVar4 == free) {
          pdVar5 = std::valarray<double>::operator[](local_80,(long)local_10c);
          *pdVar5 = 0.0;
          pdVar5 = std::valarray<double>::operator[](local_98,(long)local_10c);
          *pdVar5 = 0.0;
        }
        else {
          if (local_28 == 0) {
            local_2c0 = 0.0;
          }
          else {
            local_2c0 = *(double *)(local_28 + (long)local_10c * 8);
          }
          pdVar5 = std::valarray<double>::operator[](local_70,(long)local_10c);
          dVar6 = *pdVar5;
          pdVar5 = std::valarray<double>::operator[](local_80,(long)local_10c);
          *pdVar5 = local_2c0 - dVar6;
          dVar6 = *(double *)(in_stack_00000008 + (long)local_10c * 8);
          pdVar5 = std::valarray<double>::operator[](local_68,(long)local_10c);
          dVar7 = *pdVar5;
          pdVar5 = std::valarray<double>::operator[](local_80,(long)local_10c);
          dVar1 = *pdVar5;
          pdVar5 = std::valarray<double>::operator[](local_58,(long)local_10c);
          dVar2 = *pdVar5;
          pdVar5 = std::valarray<double>::operator[](local_98,(long)local_10c);
          *pdVar5 = (dVar6 - dVar7 * dVar1) / dVar2;
        }
      }
    }
    for (local_11c = 0; local_11c < local_40 + local_3c; local_11c = local_11c + 1) {
      SVar4 = Iterate::StateOf((Iterate *)
                               CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),0);
      local_338 = in_stack_fffffffffffffc10;
      if (SVar4 == barrier) {
        dVar6 = DotColumn(in_stack_fffffffffffffc10,(Int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
                          in_stack_fffffffffffffc00);
        if (local_18 == 0) {
          local_338 = (SparseMatrix *)0x0;
        }
        else {
          local_338 = *(SparseMatrix **)(local_18 + (long)local_11c * 8);
        }
        pdVar5 = std::valarray<double>::operator[](local_50,(long)local_11c);
        bVar3 = std::isfinite(*pdVar5);
        if (bVar3) {
          pdVar5 = std::valarray<double>::operator[](local_58,(long)local_11c);
          bVar3 = std::isfinite(*pdVar5);
          if (bVar3) {
            pdVar5 = std::valarray<double>::operator[](local_60,(long)local_11c);
            dVar7 = *pdVar5;
            pdVar5 = std::valarray<double>::operator[](local_58,(long)local_11c);
            dVar1 = *pdVar5;
            pdVar5 = std::valarray<double>::operator[](local_68,(long)local_11c);
            dVar2 = *pdVar5;
            pdVar5 = std::valarray<double>::operator[](local_50,(long)local_11c);
            if (dVar7 * dVar1 < dVar2 * *pdVar5) {
              pdVar5 = std::valarray<double>::operator[](local_90,(long)local_11c);
              dVar7 = *pdVar5;
              pdVar5 = std::valarray<double>::operator[](local_98,(long)local_11c);
              *pdVar5 = -(double)local_338 + dVar7 + dVar6;
              local_338 = in_stack_fffffffffffffc10;
            }
            else {
              pdVar5 = std::valarray<double>::operator[](local_98,(long)local_11c);
              dVar7 = *pdVar5;
              pdVar5 = std::valarray<double>::operator[](local_90,(long)local_11c);
              *pdVar5 = ((double)local_338 + dVar7) - dVar6;
              local_338 = in_stack_fffffffffffffc10;
            }
            goto LAB_0082adb4;
          }
        }
        pdVar5 = std::valarray<double>::operator[](local_50,(long)local_11c);
        bVar3 = std::isfinite(*pdVar5);
        if (bVar3) {
          pdVar5 = std::valarray<double>::operator[](local_98,(long)local_11c);
          in_stack_fffffffffffffc00 = (Vector *)(((double)local_338 + *pdVar5) - dVar6);
          in_stack_fffffffffffffc08 =
               (Vector *)std::valarray<double>::operator[](local_90,(long)local_11c);
          in_stack_fffffffffffffc08->_M_size = (size_t)in_stack_fffffffffffffc00;
        }
        else {
          dVar7 = -(double)local_338;
          pdVar5 = std::valarray<double>::operator[](local_90,(long)local_11c);
          in_stack_fffffffffffffbe0 = (Iterate *)(dVar7 + *pdVar5 + dVar6);
          pdVar5 = std::valarray<double>::operator[](local_98,(long)local_11c);
          *pdVar5 = (double)in_stack_fffffffffffffbe0;
          local_338 = in_stack_fffffffffffffc10;
        }
      }
LAB_0082adb4:
      in_stack_fffffffffffffc10 = local_338;
    }
  }
  std::valarray<double>::~valarray((valarray<double> *)in_stack_fffffffffffffbe0);
  std::valarray<double>::~valarray((valarray<double> *)in_stack_fffffffffffffbe0);
  return;
}

Assistant:

void IPM::SolveNewtonSystem(const double* rb, const double* rc,
                                    const double* rl, const double* ru,
                                    const double* sl, const double* su,
                                    Step& step) {
    const Model& model = iterate_->model();
    const Int m = model.rows();
    const Int n = model.cols();
    const SparseMatrix& AI = model.AI();
    const Vector& xl = iterate_->xl();
    const Vector& xu = iterate_->xu();
    const Vector& zl = iterate_->zl();
    const Vector& zu = iterate_->zu();
    Vector& dx = step.x;
    Vector& dxl = step.xl;
    Vector& dxu = step.xu;
    Vector& dy = step.y;
    Vector& dzl = step.zl;
    Vector& dzu = step.zu;

    // Build RHS for KKT system.
    Vector rhs1(n+m), rhs2(m);
    if (rc) {
        for (Int j = 0; j < n+m; j++)
            rhs1[j] = -rc[j];
    }
    for (Int j = 0; j < n+m; j++) {
        double rlj = rl ? rl[j] : 0.0;
        double ruj = ru ? ru[j] : 0.0;
        if (iterate_->has_barrier_lb(j))
            rhs1[j] += (sl[j] + zl[j]*rlj) / xl[j];
        if (iterate_->has_barrier_ub(j))
            rhs1[j] -= (su[j] - zu[j]*ruj) / xu[j];
        if (iterate_->StateOf(j) == Iterate::State::fixed)
            rhs1[j] = 0.0;
    }
    assert(AllFinite(rhs1));
    if (rb)
        std::copy(rb, rb+m, std::begin(rhs2));

    // Solve KKT system.
    double tol =  control_.kkt_tol() * std::sqrt(iterate_->mu());
    kkt_->Solve(rhs1, rhs2, tol, dx, dy, info_);
    if (info_->errflag)
        return;

    // Recover solution to Newton system.
    dy *= -1.0;
    for (Int j = 0; j < n+m; j++) {
        if (iterate_->StateOf(j) == Iterate::State::fixed) {
            assert(dx[j] == 0.0);
            dxl[j] = 0.0;
            dzl[j] = 0.0;
        } else if (iterate_->StateOf(j) == Iterate::State::free) {
            assert(!rl || rl[j] == 0.0);
            dxl[j] = 0.0;
            dzl[j] = 0.0;
        } else {
            double rlj = rl ? rl[j] : 0.0;
            dxl[j] = dx[j] - rlj;
            dzl[j] = (sl[j] - zl[j]*dxl[j]) / xl[j];
        }
    }
    for (Int j = 0; j < n+m; j++) {
        if (iterate_->StateOf(j) == Iterate::State::fixed) {
            assert(dx[j] == 0.0);
            dxu[j] = 0.0;
            dzu[j] = 0.0;
        } else if (iterate_->StateOf(j) == Iterate::State::free) {
            assert(!ru || ru[j] == 0.0);
            dxu[j] = 0.0;
            dzu[j] = 0.0;
        } else {
            double ruj = ru ? ru[j] : 0.0;
            dxu[j] = ruj - dx[j];
            dzu[j] = (su[j] - zu[j]*dxu[j]) / xu[j];
        }
    }
    assert(AllFinite(dxl));
    assert(AllFinite(dxu));
    assert(AllFinite(dzl));
    assert(AllFinite(dzu));

    // Shift residual to the last two block equations.
    for (Int j = 0; j < n+m; j++) {
        if (iterate_->StateOf(j) == Iterate::State::barrier) {
            assert(std::isfinite(xl[j]) || std::isfinite(xu[j]));
            double atdy = DotColumn(AI, j, dy);
            double rcj = rc ? rc[j] : 0.0;
            if (std::isfinite(xl[j]) && std::isfinite(xu[j])) {
                if (zl[j]*xu[j] >= zu[j]*xl[j])
                    dzl[j] = rcj + dzu[j] - atdy;
                else
                    dzu[j] = -rcj + dzl[j] + atdy;
            } else if (std::isfinite(xl[j])) {
                dzl[j] = rcj + dzu[j] - atdy;
            } else {
                dzu[j] = -rcj + dzl[j] + atdy;
            }
        }
    }

    #ifndef NDEBUG
    // Check solution for free and fixed variables.
    for (Int j = 0; j < n+m; j++) {
        if (iterate_->StateOf(j) == Iterate::State::fixed) {
            assert(dx[j] == 0.0);
            assert(dxl[j] == 0.0 && dxu[j] == 0.0);
            assert(dzl[j] == 0.0 && dzu[j] == 0.0);
        }
        if (iterate_->StateOf(j) == Iterate::State::free)
            assert(dzl[j] == 0.0 && dzu[j] == 0.0);
    }
    #endif
}